

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockAreaLayout::itemAt(QDockAreaLayout *this,int *x,int index)

{
  int iVar1;
  QLayoutItem *pQVar2;
  long lVar3;
  
  lVar3 = 0x40;
  do {
    pQVar2 = QDockAreaLayoutInfo::itemAt
                       ((QDockAreaLayoutInfo *)((long)this->corners + lVar3),x,index);
    if (pQVar2 != (QLayoutItem *)0x0) {
      return pQVar2;
    }
    lVar3 = lVar3 + 0x70;
  } while (lVar3 != 0x200);
  if ((this->centralWidgetItem == (QLayoutItem *)0x0) ||
     (iVar1 = *x, *x = iVar1 + 1, iVar1 != index)) {
    pQVar2 = (QLayoutItem *)0x0;
  }
  else {
    pQVar2 = this->centralWidgetItem;
  }
  return pQVar2;
}

Assistant:

QLayoutItem *QDockAreaLayout::itemAt(int *x, int index) const
{
    Q_ASSERT(x != nullptr);

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (QLayoutItem *ret = dock.itemAt(x, index))
            return ret;
    }

    if (centralWidgetItem && (*x)++ == index)
        return centralWidgetItem;

    return nullptr;
}